

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O2

ssize_t __thiscall diffusion::ShmWriter::write(ShmWriter *this,int __fd,void *__buf,size_t __n)

{
  uint32_t *puVar1;
  undefined4 in_register_00000034;
  Size size_prefix;
  
  size_prefix = (Size)__buf;
  cyclic_write(this,(char *)&size_prefix,4);
  cyclic_write(this,(char *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  puVar1 = (uint32_t *)this->shm_header_position_;
  *puVar1 = this->writer_shm_body_offset_;
  return (ssize_t)puVar1;
}

Assistant:

void ShmWriter::write(char const *data, std::size_t size) {
    auto size_prefix = static_cast<Size>(size);
    this->cyclic_write(reinterpret_cast<char const *>(&size_prefix), sizeof(size_prefix));
    this->cyclic_write(data, size);
    this->commit();
}